

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::write_puts(Rdma *this)

{
  reference pvVar1;
  size_t sVar2;
  Memblock *pMVar3;
  char *__dest;
  void *__src;
  char *dst_addr;
  size_t dst_offset;
  size_t dst_slot;
  size_t size;
  value_type local_40;
  size_t end;
  undefined1 local_30 [4];
  int p;
  TicToc t;
  Rdma *this_local;
  
  t.m_nbytes = (size_t)this;
  TicToc::TicToc((TicToc *)local_30,PUT,0);
  for (end._4_4_ = 0; end._4_4_ < this->m_nprocs; end._4_4_ = end._4_4_ + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&(this->m_recv_actions).m_get_buffer_offset,(long)end._4_4_);
    local_40 = *pvVar1;
    A2A::recv_rewind(&this->m_second_exchange,end._4_4_);
    while( true ) {
      sVar2 = A2A::recv_pos(&this->m_second_exchange,end._4_4_);
      if (local_40 <= sVar2) break;
      deserial<unsigned_long>(&this->m_second_exchange,end._4_4_,&dst_slot);
      deserial<unsigned_long>(&this->m_second_exchange,end._4_4_,&dst_offset);
      deserial<unsigned_long>(&this->m_second_exchange,end._4_4_,(unsigned_long *)&dst_addr);
      pMVar3 = slot(this,this->m_pid,dst_offset);
      __dest = dst_addr + (long)pMVar3->addr;
      __src = A2A::recv_top(&this->m_second_exchange,end._4_4_);
      memcpy(__dest,__src,dst_slot);
      A2A::recv_pop(&this->m_second_exchange,end._4_4_,dst_slot);
    }
    TicToc::add_bytes((TicToc *)local_30,local_40);
  }
  TicToc::~TicToc((TicToc *)local_30);
  return;
}

Assistant:

void Rdma::write_puts()
{
#ifdef PROFILE
    TicToc t(TicToc::PUT);
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t end = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_rewind( p );
        while ( m_second_exchange.recv_pos( p ) < end ) {
            size_t size, dst_slot, dst_offset;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, dst_slot);
            deserial( m_second_exchange, p, dst_offset );
           
            char * dst_addr =
               static_cast<char *>(slot( m_pid, dst_slot ).addr );
            dst_addr += dst_offset;
            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        t.add_bytes( end );
#endif
   }
}